

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CfgNode.cpp
# Opt level: O1

set<CfgSignalHandler_*,_std::less<CfgSignalHandler_*>,_std::allocator<CfgSignalHandler_*>_> *
__thiscall
CfgNode::BlockData::signalHandlers
          (set<CfgSignalHandler_*,_std::less<CfgSignalHandler_*>,_std::allocator<CfgSignalHandler_*>_>
           *__return_storage_ptr__,BlockData *this)

{
  iterator iVar1;
  const_iterator __position;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  _Base_ptr local_40;
  _Alloc_node local_38;
  
  __position._M_node = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       __position._M_node;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       __position._M_node;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = (this->m_signalHandlers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(this->m_signalHandlers)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 != p_Var3) {
    do {
      local_40 = p_Var2[1]._M_parent;
      local_38._M_t = &__return_storage_ptr__->_M_t;
      iVar1 = std::
              _Rb_tree<CfgSignalHandler*,CfgSignalHandler*,std::_Identity<CfgSignalHandler*>,std::less<CfgSignalHandler*>,std::allocator<CfgSignalHandler*>>
              ::
              _M_insert_unique_<CfgSignalHandler*,std::_Rb_tree<CfgSignalHandler*,CfgSignalHandler*,std::_Identity<CfgSignalHandler*>,std::less<CfgSignalHandler*>,std::allocator<CfgSignalHandler*>>::_Alloc_node>
                        ((_Rb_tree<CfgSignalHandler*,CfgSignalHandler*,std::_Identity<CfgSignalHandler*>,std::less<CfgSignalHandler*>,std::allocator<CfgSignalHandler*>>
                          *)__return_storage_ptr__,__position,(CfgSignalHandler **)&local_40,
                         &local_38);
      __position._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar1._M_node);
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::set<CfgSignalHandler*> CfgNode::BlockData::signalHandlers() const {
	std::set<CfgSignalHandler*> cfgSignalHandlers;

	std::transform(m_signalHandlers.begin(), m_signalHandlers.end(),
			std::inserter(cfgSignalHandlers, cfgSignalHandlers.begin()),
			[](const std::map<int, CfgSignalHandler*>::value_type &pair) {
					return pair.second;
			}
	);

	return cfgSignalHandlers;
}